

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QtWidgetsExtraCache.cpp
# Opt level: O2

QtWidgetsExtraCache * __thiscall
QtWidgetsExtraCache::cachedPixmapColor(QtWidgetsExtraCache *this,QColor *color,QSize *size)

{
  char cVar1;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QString key;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_30;
  
  local_b0.d = (Data *)0x0;
  local_b0.ptr = L"%1-%2x%3-pixmap";
  local_b0.size = 0xf;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  QColor::name((NameFormat)&local_48);
  QString::arg((QString *)&local_30,(int)&local_b0,(QChar)(char16_t)&local_48);
  QString::arg((QString *)&local_98,(QString *)&local_30,size->wd,0,10,(QChar)0x20);
  QString::arg(&key,(QString *)&local_98,size->ht,0,10,(QChar)0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  cachedPixmap(this,&key);
  cVar1 = QPixmap::isNull();
  if (cVar1 != '\0') {
    QPixmap::QPixmap((QPixmap *)&local_98,size);
    QPixmap::operator=((QPixmap *)this,(QPixmap *)&local_98);
    QPixmap::~QPixmap((QPixmap *)&local_98);
    QPixmap::fill((QColor *)this);
    cachePixmap(&key,(QPixmap *)this);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&key.d);
  return this;
}

Assistant:

QPixmap QtWidgetsExtraCache::cachedPixmapColor(const QColor &color, const QSize &size) {
    const QString key = QString(QStringLiteral("%1-%2x%3-pixmap"))
                            .arg(color.name(QColor::HexArgb))
                            .arg(size.width())
                            .arg(size.height());
    QPixmap pixmap = QtWidgetsExtraCache::cachedPixmap(key);

    if (pixmap.isNull()) {
        pixmap = QPixmap(size);
        pixmap.fill(color);
        QtWidgetsExtraCache::cachePixmap(key, pixmap);
    }

    return pixmap;
}